

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O1

Name __thiscall wasm::UniqueNameMapper::sourceToUnique(UniqueNameMapper *this,Name sName)

{
  map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  *this_00;
  pointer pNVar1;
  pointer pNVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  string *psVar5;
  char **ppcVar6;
  Name NVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  Name sName_local;
  
  sName_local.super_IString.str._M_len = sName.super_IString.str._M_str;
  local_38 = sName.super_IString.str._M_len;
  pNVar2 = (pointer)&DELEGATE_CALLER_TARGET;
  if (DAT_010d2868 == (char *)sName_local.super_IString.str._M_len) {
    ppcVar6 = &DAT_010d2868;
  }
  else {
    this_00 = &this->labelMappings;
    iVar3 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
            ::find(&this_00->_M_t,(key_type *)local_38);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->labelMappings)._M_t._M_impl.super__Rb_tree_header) {
      psVar5 = (string *)__cxa_allocate_exception(0x30);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,sName_local.super_IString.str._M_len,
                 (long)local_38 + sName_local.super_IString.str._M_len);
      std::operator+(&local_98,"bad label in sourceToUnique: ",&local_58);
      *(string **)psVar5 = psVar5 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                (psVar5,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      *(undefined4 *)(psVar5 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar5 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar5 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar5 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar5,&ParseException::typeinfo,ParseException::~ParseException);
    }
    pmVar4 = std::
             map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[](this_00,(key_type *)local_38);
    if ((pmVar4->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pmVar4->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      psVar5 = (string *)__cxa_allocate_exception(0x30);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,sName_local.super_IString.str._M_len,
                 (long)local_38 + sName_local.super_IString.str._M_len);
      std::operator+(&local_78,"use of popped label in sourceToUnique: ",&local_58);
      *(string **)psVar5 = psVar5 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                (psVar5,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      *(undefined4 *)(psVar5 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar5 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar5 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar5 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar5,&ParseException::typeinfo,ParseException::~ParseException);
    }
    pmVar4 = std::
             map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[](this_00,(key_type *)local_38);
    pNVar1 = (pmVar4->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pNVar2 = pNVar1 + -1;
    ppcVar6 = &pNVar1[-1].super_IString.str._M_str;
  }
  NVar7.super_IString.str._M_str = *ppcVar6;
  NVar7.super_IString.str._M_len = (pNVar2->super_IString).str._M_len;
  return (Name)NVar7.super_IString.str;
}

Assistant:

Name UniqueNameMapper::sourceToUnique(Name sName) {
  // DELEGATE_CALLER_TARGET is a fake target used to denote delegating to the
  // caller. We do not need to modify it, as it has no definitions, only uses.
  if (sName == DELEGATE_CALLER_TARGET) {
    return DELEGATE_CALLER_TARGET;
  }
  if (labelMappings.find(sName) == labelMappings.end()) {
    throw ParseException("bad label in sourceToUnique: " + sName.toString());
  }
  if (labelMappings[sName].empty()) {
    throw ParseException("use of popped label in sourceToUnique: " +
                         sName.toString());
  }
  return labelMappings[sName].back();
}